

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3img.cpp
# Opt level: O2

void __thiscall CTcGenTarg::build_source_line_maps(CTcGenTarg *this)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  CTcStreamAnchor *pCVar6;
  CTcTokFileDesc *this_00;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  
  pCVar6 = (CTcStreamAnchor *)&(G_cs->super_CTcDataStream).first_anchor_;
  while (pCVar6 = pCVar6->nxt_, pCVar6 != (CTcStreamAnchor *)0x0) {
    uVar8 = pCVar6->ofs_;
    uVar1 = pCVar6->addr_;
    uVar2 = CTcDataStream::readu2_at(&G_cs->super_CTcDataStream,uVar8 + 8);
    if (uVar2 != 0) {
      lVar7 = uVar8 + uVar2;
      uVar2 = CTcDataStream::readu2_at(&G_cs->super_CTcDataStream,G_sizes.dbg_hdr + lVar7);
      uVar8 = lVar7 + G_sizes.dbg_hdr + 2;
      while (bVar9 = uVar2 != 0, uVar2 = uVar2 - 1, bVar9) {
        uVar3 = CTcDataStream::readu2_at(&G_cs->super_CTcDataStream,uVar8);
        uVar4 = CTcDataStream::readu2_at(&G_cs->super_CTcDataStream,uVar8 + 2);
        uVar5 = CTcDataStream::readu4_at(&G_cs->super_CTcDataStream,uVar8 + 4);
        this_00 = G_tok->desc_list_[uVar4]->orig_;
        if (this_00 == (CTcTokFileDesc *)0x0) {
          this_00 = G_tok->desc_list_[uVar4];
        }
        CTcTokFileDesc::add_source_line(this_00,(ulong)uVar5,uVar3 + uVar1);
        uVar8 = uVar8 + (long)G_sizes.dbg_line;
      }
    }
  }
  return;
}

Assistant:

void CTcGenTarg::build_source_line_maps()
{
    CTcStreamAnchor *anchor;

    /* go through the list of anchors in the code stream */
    for (anchor = G_cs->get_first_anchor() ; anchor != 0 ;
         anchor = anchor->nxt_)
    {
        ulong start_ofs;
        ulong start_addr;
        ulong dbg_ofs;
        uint cnt;
        ulong ofs;

        /* get the anchor's stream offset */
        start_ofs = anchor->get_ofs();

        /* get the anchor's absolute address in the image file */
        start_addr = anchor->get_addr();

        /* read the debug table offset from the method header */
        dbg_ofs = start_ofs + G_cs->readu2_at(start_ofs + 8);

        /* if there's no debug table for this method, go on to the next */
        if (dbg_ofs == start_ofs)
            continue;

        /* read the number of line entries */
        cnt = G_cs->readu2_at(dbg_ofs + G_sizes.dbg_hdr);

        /* go through the individual line entries */
        for (ofs = dbg_ofs + G_sizes.dbg_hdr + 2 ; cnt != 0 ;
             --cnt, ofs += G_sizes.dbg_line)
        {
            uint file_id;
            ulong linenum;
            uint method_ofs;
            ulong line_addr;
            CTcTokFileDesc *file_desc;
            
            /* 
             *   get the file position, and the byte-code offset from the
             *   start of the method of the executable code for the line 
             */
            method_ofs = G_cs->readu2_at(ofs);
            file_id = G_cs->readu2_at(ofs + 2);
            linenum = G_cs->readu4_at(ofs + 4);

            /* calculate the absolute address of the line in the image file */
            line_addr = start_addr + method_ofs;

            /* find the given file descriptor */
            file_desc = G_tok->get_filedesc(file_id);

            /* 
             *   get the original file descriptor, since we always want to
             *   add to the original, not to the duplicates, if the file
             *   appears more than once (because this is a one-way mapping
             *   from file to byte-code location - we thus require a
             *   single index)
             */
            if (file_desc->get_orig() != 0)
                file_desc = file_desc->get_orig();

            /* add this line to the file descriptor */
            file_desc->add_source_line(linenum, line_addr);
        }
    }
}